

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O3

void __thiscall level_info_t::ClearDefered(level_info_t *this)

{
  acsdefered_t *paVar1;
  acsdefered_t *paVar2;
  
  paVar2 = this->defered;
  while (paVar2 != (acsdefered_t *)0x0) {
    paVar1 = paVar2->next;
    operator_delete(paVar2,0x20);
    paVar2 = paVar1;
  }
  this->defered = (acsdefered_t *)0x0;
  return;
}

Assistant:

void level_info_t::ClearDefered()
{
	acsdefered_t *def = defered;
	while (def)
	{
		acsdefered_t *next = def->next;
		delete def;
		def = next;
	}
	defered = NULL;
}